

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

void __thiscall
llvm::cl::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::printOptionValue(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t GlobalWidth,bool Force)

{
  StringRef V;
  bool bVar1;
  undefined7 in_register_00000011;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  this_00 = this;
  if ((int)CONCAT71(in_register_00000011,Force) == 0) {
    this_00 = (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->
                  super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                  ).Default;
    bVar1 = OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::compare((OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00,
                      &(this->
                       super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                       ).super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>);
    if (!bVar1) {
      return;
    }
  }
  V.Data = (this->
           super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
           ).super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>._M_dataplus.
           _M_p;
  V.Length = (this->
             super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
             ).super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
             _M_string_length;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  printOptionDiff((parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00,&this->super_Option,V,
                  &(this->
                   super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                   ).Default,GlobalWidth);
  return;
}

Assistant:

void printOptionValue(size_t GlobalWidth, bool Force) const override {
    if (Force || this->getDefault().compare(this->getValue())) {
      cl::printOptionDiff<ParserClass>(*this, Parser, this->getValue(),
                                       this->getDefault(), GlobalWidth);
    }
  }